

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLoader.c
# Opt level: O2

DATA_LOADER * FileLoader_Init(char *fileName)

{
  DATA_LOADER *loader;
  void *context;
  char *pcVar1;
  
  loader = (DATA_LOADER *)calloc(1,0x28);
  if (loader != (DATA_LOADER *)0x0) {
    context = calloc(1,0x40);
    if (context != (void *)0x0) {
      pcVar1 = strdup(fileName);
      *(char **)((long)context + 0x10) = pcVar1;
      DataLoader_Setup(loader,&fileLoader,context);
      return loader;
    }
    free(loader);
  }
  return (DATA_LOADER *)0x0;
}

Assistant:

DATA_LOADER *FileLoader_Init(const char *fileName)
{
	DATA_LOADER *dLoader;
	FILE_LOADER *fLoader;

	dLoader = (DATA_LOADER *)calloc(1, sizeof(DATA_LOADER));
	if(dLoader == NULL) return NULL;

	fLoader = (FILE_LOADER *)calloc(1, sizeof(FILE_LOADER));
	if(fLoader == NULL)
	{
		free(dLoader);
		return NULL;
	}

	fLoader->fileName = strdup(fileName);

	DataLoader_Setup(dLoader,&fileLoader,fLoader);

	return dLoader;
}